

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_51181::P::parseInt(P *this,string *input,int64_t *out)

{
  int iVar1;
  pair<bool,_ccs::Value> pr;
  pair<bool,_ccs::Value> local_80;
  
  parseAndReturnValue(&local_80,this,input);
  if (local_80.first == true) {
    iVar1 = ::ccs::Value::asInt(&local_80.second);
    *out = (long)iVar1;
  }
  ::ccs::Value::~Value(&local_80.second);
  return local_80.first == true;
}

Assistant:

bool parseInt(const std::string &input, int64_t &out) {
    auto pr = parseAndReturnValue(input);
    if (!pr.first) return false;
    try {
      out = pr.second.asInt();
    } catch (ccs::bad_coercion &) {
      return false;
    }
    return true;
  }